

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

void djgp_release(djg_program *program)

{
  djg_program *pdVar1;
  
  if (program == (djg_program *)0x0) {
    __assert_fail("program",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x1ab,"void djgp_release(djg_program *)");
  }
  while (program != (djg_program *)0x0) {
    pdVar1 = program->next;
    free(program->src);
    free(program);
    program = pdVar1;
  }
  return;
}

Assistant:

DJGDEF void djgp_release(djg_program *program)
{
    djg_program *tmp;

    DJG_ASSERT(program);
    while (program) {
        tmp = program;
        program = program->next;
        DJG_FREE(tmp->src);
        DJG_FREE(tmp);
    }
}